

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

int Kit_DsdTestCofs(Kit_DsdNtk_t *pNtk,uint *pTruthInit)

{
  uint *pOut;
  uint *puVar1;
  int iVar2;
  Kit_DsdNtk_t *pKVar3;
  Kit_DsdNtk_t *pNtk_00;
  Kit_DsdNtk_t *pNtk_01;
  int RetValue;
  int fVerbose;
  uint *pTruth;
  uint i;
  uint *pCofs2 [2];
  Kit_DsdNtk_t *pTemp;
  Kit_DsdNtk_t *pNtk1;
  Kit_DsdNtk_t *pNtk0;
  uint *pTruthInit_local;
  Kit_DsdNtk_t *pNtk_local;
  
  pOut = pNtk->pMem;
  puVar1 = pNtk->pMem;
  iVar2 = Kit_TruthWordNum((uint)pNtk->nVars);
  printf("Function: ");
  Extra_PrintHexadecimal(_stdout,pTruthInit,(uint)pNtk->nVars);
  printf("\n");
  Kit_DsdPrint(_stdout,pNtk);
  printf("\n");
  for (pTruth._4_4_ = 0; pTruth._4_4_ < pNtk->nVars; pTruth._4_4_ = pTruth._4_4_ + 1) {
    Kit_TruthCofactor0New(pOut,pTruthInit,(uint)pNtk->nVars,pTruth._4_4_);
    pKVar3 = Kit_DsdDecompose(pOut,(uint)pNtk->nVars);
    pNtk_00 = Kit_DsdExpand(pKVar3);
    Kit_DsdNtkFree(pKVar3);
    printf("Cof%d0: ",(ulong)pTruth._4_4_);
    Kit_DsdPrint(_stdout,pNtk_00);
    printf("\n");
    Kit_TruthCofactor1New(puVar1 + iVar2,pTruthInit,(uint)pNtk->nVars,pTruth._4_4_);
    pKVar3 = Kit_DsdDecompose(puVar1 + iVar2,(uint)pNtk->nVars);
    pNtk_01 = Kit_DsdExpand(pKVar3);
    Kit_DsdNtkFree(pKVar3);
    printf("Cof%d1: ",(ulong)pTruth._4_4_);
    Kit_DsdPrint(_stdout,pNtk_01);
    printf("\n");
    Kit_DsdNtkFree(pNtk_00);
    Kit_DsdNtkFree(pNtk_01);
  }
  printf("\n");
  return 0;
}

Assistant:

int Kit_DsdTestCofs( Kit_DsdNtk_t * pNtk, unsigned * pTruthInit )
{
    Kit_DsdNtk_t * pNtk0, * pNtk1, * pTemp;
//    Kit_DsdObj_t * pRoot;
    unsigned * pCofs2[2] = { pNtk->pMem, pNtk->pMem + Kit_TruthWordNum(pNtk->nVars) };
    unsigned i, * pTruth;
    int fVerbose = 1;
    int RetValue = 0;

    pTruth = pTruthInit;
//    pRoot = Kit_DsdNtkRoot(pNtk);
//    pTruth = Kit_DsdObjTruth(pRoot);
//    assert( pRoot->nFans == pNtk->nVars );

    if ( fVerbose )
    {
        printf( "Function: " );
//        Extra_PrintBinary( stdout, pTruth, (1 << pNtk->nVars) ); 
        Extra_PrintHexadecimal( stdout, pTruth, pNtk->nVars ); 
        printf( "\n" );
        Kit_DsdPrint( stdout, pNtk ), printf( "\n" );
    }
    for ( i = 0; i < pNtk->nVars; i++ )
    {
        Kit_TruthCofactor0New( pCofs2[0], pTruth, pNtk->nVars, i );
        pNtk0 = Kit_DsdDecompose( pCofs2[0], pNtk->nVars );
        pNtk0 = Kit_DsdExpand( pTemp = pNtk0 );
        Kit_DsdNtkFree( pTemp );

        if ( fVerbose )
        {
            printf( "Cof%d0: ", i );
            Kit_DsdPrint( stdout, pNtk0 ), printf( "\n" );
        }

        Kit_TruthCofactor1New( pCofs2[1], pTruth, pNtk->nVars, i );
        pNtk1 = Kit_DsdDecompose( pCofs2[1], pNtk->nVars );
        pNtk1 = Kit_DsdExpand( pTemp = pNtk1 );
        Kit_DsdNtkFree( pTemp );

        if ( fVerbose )
        {
            printf( "Cof%d1: ", i );
            Kit_DsdPrint( stdout, pNtk1 ), printf( "\n" );
        }

//        if ( Kit_DsdCheckVar4Dec2( pNtk0, pNtk1 ) )
//            RetValue = 1;

        Kit_DsdNtkFree( pNtk0 );
        Kit_DsdNtkFree( pNtk1 );
    }
    if ( fVerbose )
        printf( "\n" );

    return RetValue;
}